

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

char * host_ca_save(host_ca *hca)

{
  char *__s;
  ptrlen input;
  int iVar1;
  int iVar2;
  char *pcVar3;
  FILE *__s_00;
  size_t sVar4;
  char *pcVar5;
  ptrlen data;
  
  if (*hca->name == '\0') {
    pcVar3 = dupstr("CA record must have a name");
    return pcVar3;
  }
  pcVar3 = make_filename(7,hca->name);
  __s_00 = fopen(pcVar3,"w");
  if (__s_00 != (FILE *)0x0) {
    fwrite("PublicKey=",10,1,__s_00);
    input.ptr = hca->ca_public_key->u;
    input.len = hca->ca_public_key->len;
    pcVar5 = (char *)0x0;
    base64_encode_fp((FILE *)__s_00,input,0);
    fputc(10,__s_00);
    fwrite("Validity=",9,1,__s_00);
    __s = hca->validity_expression;
    sVar4 = strlen(__s);
    data.len = sVar4;
    data.ptr = __s;
    percent_encode_fp((FILE *)__s_00,data,(char *)0x0);
    fputc(10,__s_00);
    fprintf(__s_00,"PermitRSASHA1=%d\n",(ulong)(hca->opts).permit_rsa_sha1);
    fprintf(__s_00,"PermitRSASHA256=%d\n",(ulong)(hca->opts).permit_rsa_sha256);
    fprintf(__s_00,"PermitRSASHA512=%d\n",(ulong)(hca->opts).permit_rsa_sha512);
    iVar1 = ferror(__s_00);
    iVar2 = fclose(__s_00);
    if ((iVar1 != 0) || (iVar2 < 0)) {
      pcVar5 = dupprintf("Unable to write file \'%s\'",pcVar3);
    }
    safefree(pcVar3);
    return pcVar5;
  }
  pcVar3 = dupprintf("Unable to open file \'%s\'",pcVar3);
  return pcVar3;
}

Assistant:

char *host_ca_save(host_ca *hca)
{
    if (!*hca->name)
        return dupstr("CA record must have a name");

    char *filename = make_filename(INDEX_HOSTCA, hca->name);
    FILE *fp = fopen(filename, "w");
    if (!fp)
        return dupprintf("Unable to open file '%s'", filename);

    fprintf(fp, "PublicKey=");
    base64_encode_fp(fp, ptrlen_from_strbuf(hca->ca_public_key), 0);
    fprintf(fp, "\n");

    fprintf(fp, "Validity=");
    percent_encode_fp(fp, ptrlen_from_asciz(hca->validity_expression), NULL);
    fprintf(fp, "\n");

    fprintf(fp, "PermitRSASHA1=%d\n", (int)hca->opts.permit_rsa_sha1);
    fprintf(fp, "PermitRSASHA256=%d\n", (int)hca->opts.permit_rsa_sha256);
    fprintf(fp, "PermitRSASHA512=%d\n", (int)hca->opts.permit_rsa_sha512);

    bool bad = ferror(fp);
    if (fclose(fp) < 0)
        bad = true;

    char *err = NULL;
    if (bad)
        err = dupprintf("Unable to write file '%s'", filename);

    sfree(filename);
    return err;
}